

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

uint16_t __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<unsigned_short>(OgreXmlSerializer *this,char *name)

{
  XmlReader *reader;
  char *__s;
  bool bVar1;
  uint32_t uVar2;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *name_local;
  OgreXmlSerializer *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  bVar1 = HasAttribute(this,name);
  __s = local_18;
  if (!bVar1) {
    reader = this->m_reader;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    ThrowAttibuteError(reader,&local_38,&local_70);
  }
  uVar2 = ReadAttribute<unsigned_int>(this,local_18);
  return (uint16_t)uVar2;
}

Assistant:

uint16_t OgreXmlSerializer::ReadAttribute<uint16_t>(const char *name) const
{
    if (HasAttribute(name))
    {
        return static_cast<uint16_t>(ReadAttribute<uint32_t>(name));
    }
    else
    {
        ThrowAttibuteError(m_reader, name);
    }
    return 0;
}